

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O2

void __thiscall
duckdb::Connection::CreateScalarFunction<signed_char,signed_char,signed_char>
          (Connection *this,string *name,_func_char_char_char *udf_func)

{
  type context;
  scalar_function_t function;
  LogicalType aLStack_68 [24];
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> local_50;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/include/duckdb/function/udf_function.hpp:158:36)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/include/duckdb/function/udf_function.hpp:158:36)>
             ::_M_manager;
  local_30._M_unused._0_8_ = (undefined8)udf_func;
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            (&local_50,
             (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             &local_30);
  context = shared_ptr<duckdb::ClientContext,_true>::operator*
                      ((shared_ptr<duckdb::ClientContext,_true> *)this);
  duckdb::LogicalType::LogicalType(aLStack_68,INVALID);
  UDFWrapper::RegisterFunction<signed_char,signed_char,signed_char>
            (name,&local_50,context,aLStack_68);
  duckdb::LogicalType::~LogicalType(aLStack_68);
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_50);
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_30);
  return;
}

Assistant:

void CreateScalarFunction(const string &name, TR (*udf_func)(ARGS...)) {
		scalar_function_t function = UDFWrapper::CreateScalarFunction<TR, ARGS...>(name, udf_func);
		UDFWrapper::RegisterFunction<TR, ARGS...>(name, function, *context);
	}